

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_trust_anchors_parse_clienthello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  Array<unsigned_char> *this;
  Span<const_unsigned_char> SVar4;
  bssl *local_48;
  undefined1 local_38 [8];
  CBS child;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  if ((contents != (CBS *)0x0) &&
     (child.len = (size_t)contents, uVar2 = ssl_protocol_version(hs->ssl), 0x303 < uVar2)) {
    iVar3 = CBS_get_u16_length_prefixed((CBS *)child.len,(CBS *)local_38);
    if (iVar3 != 0) {
      SVar4 = cbs_st::operator_cast_to_Span((cbs_st *)local_38);
      local_48 = (bssl *)SVar4.data_;
      SVar4.data_ = SVar4.size_;
      bVar1 = ssl_is_valid_trust_anchor_list(local_48,SVar4);
      if (bVar1) {
        std::optional<bssl::Array<unsigned_char>_>::emplace<>(&hs->peer_requested_trust_anchors);
        this = std::optional<bssl::Array<unsigned_char>_>::operator->
                         (&hs->peer_requested_trust_anchors);
        SVar4 = cbs_st::operator_cast_to_Span((cbs_st *)local_38);
        bVar1 = Array<unsigned_char>::CopyFrom(this,SVar4);
        if (!bVar1) {
          *out_alert = 'P';
          return false;
        }
        return true;
      }
    }
    *out_alert = '2';
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0xa6e);
    return false;
  }
  return true;
}

Assistant:

static bool ext_trust_anchors_parse_clienthello(SSL_HANDSHAKE *hs,
                                                uint8_t *out_alert,
                                                CBS *contents) {
  if (contents == nullptr || ssl_protocol_version(hs->ssl) < TLS1_3_VERSION) {
    return true;
  }

  CBS child;
  if (!CBS_get_u16_length_prefixed(contents, &child) ||
      !ssl_is_valid_trust_anchor_list(child)) {
    *out_alert = SSL_AD_DECODE_ERROR;
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }

  hs->peer_requested_trust_anchors.emplace();
  if (!hs->peer_requested_trust_anchors->CopyFrom(child)) {
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return false;
  }
  return true;
}